

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HModel.cpp
# Opt level: O0

void __thiscall HModel::replaceWithNewBasis(HModel *this,int *XbasicIndex)

{
  int iVar1;
  reference pvVar2;
  long in_RSI;
  long in_RDI;
  int var_1;
  int row;
  int var;
  int in_stack_ffffffffffffffcc;
  undefined4 in_stack_ffffffffffffffd0;
  int in_stack_ffffffffffffffd4;
  undefined4 local_18;
  undefined4 local_14;
  
  for (local_14 = 0; local_14 < *(int *)(in_RDI + 0x614); local_14 = local_14 + 1) {
    pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x768),(long)local_14);
    *pvVar2 = 1;
  }
  *(undefined4 *)(in_RDI + 0x578) = 0;
  for (local_18 = 0; local_18 < *(int *)(in_RDI + 0x610); local_18 = local_18 + 1) {
    iVar1 = *(int *)(in_RSI + (long)local_18 * 4);
    if (*(int *)(in_RDI + 0x60c) <= iVar1) {
      *(int *)(in_RDI + 0x578) = *(int *)(in_RDI + 0x578) + 1;
    }
    in_stack_ffffffffffffffd4 = iVar1;
    pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x750),(long)local_18);
    *pvVar2 = in_stack_ffffffffffffffd4;
    pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x768),(long)iVar1);
    *pvVar2 = 0;
  }
  populate_WorkArrays((HModel *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
  mlFg_Update((HModel *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
              in_stack_ffffffffffffffcc);
  return;
}

Assistant:

void HModel::replaceWithNewBasis(const int* XbasicIndex) {
  // Replace basis with a new basis then populate (where possible)
  // work* arrays

  //  printf("replaceWithNewBasis: \n");
  for (int var = 0; var < numTot; var++) {
    nonbasicFlag[var] = NONBASIC_FLAG_TRUE;
  }
  numBasicLogicals = 0;
  for (int row = 0; row < numRow; row++) {
    int var = XbasicIndex[row];
    if (var >= numCol) numBasicLogicals++;
    basicIndex[row] = var;
    nonbasicFlag[var] = NONBASIC_FLAG_FALSE;
  }

  populate_WorkArrays();

  //Deduce the consequences of a new basis
  mlFg_Update(mlFg_action_NewBasis);
}